

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

double despot::POMCP::Rollout(State *particle,int depth,DSPOMDP *model,POMCPPrior *prior)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  undefined8 uStack_48;
  bool terminal;
  OBS_TYPE obs;
  double reward;
  POMCPPrior *pPStack_30;
  ACT_TYPE action;
  POMCPPrior *prior_local;
  DSPOMDP *model_local;
  State *pSStack_18;
  int depth_local;
  State *particle_local;
  
  if (depth < DAT_00278a70) {
    pPStack_30 = prior;
    prior_local = (POMCPPrior *)model;
    model_local._4_4_ = depth;
    pSStack_18 = particle;
    reward._4_4_ = POMCPPrior::GetAction(prior,particle);
    uVar1 = (*prior_local->_vptr_POMCPPrior[4])
                      (prior_local,pSStack_18,(ulong)reward._4_4_,&obs,&stack0xffffffffffffffb8);
    if ((uVar1 & 1) == 0) {
      (*pPStack_30->_vptr_POMCPPrior[6])(pPStack_30,(ulong)reward._4_4_,uStack_48);
      dVar2 = Globals::Discount();
      dVar3 = Rollout(pSStack_18,model_local._4_4_ + 1,(DSPOMDP *)prior_local,pPStack_30);
      obs = (OBS_TYPE)(dVar2 * dVar3 + (double)obs);
      (*pPStack_30->_vptr_POMCPPrior[7])();
    }
    particle_local = (State *)obs;
  }
  else {
    particle_local = (State *)0x0;
  }
  return (double)particle_local;
}

Assistant:

double POMCP::Rollout(State* particle, int depth, const DSPOMDP* model,
	POMCPPrior* prior) {
	if (depth >= Globals::config.search_depth) {
		return 0;
	}

	ACT_TYPE action = prior->GetAction(*particle);

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, action, reward, obs);
	if (!terminal) {
		prior->Add(action, obs);
		reward += Globals::Discount() * Rollout(particle, depth + 1, model, prior);
		prior->PopLast();
	}

	return reward;
}